

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O1

bool __thiscall duckdb::BoundCastExpression::CanThrow(BoundCastExpression *this)

{
  bool bVar1;
  pointer pEVar2;
  undefined1 uVar3;
  bool changes_type;
  LogicalType child_type;
  undefined1 local_91;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&this->child);
  LogicalType::LogicalType(&local_90,&pEVar2->return_type);
  if ((this->super_Expression).return_type.id_ == local_90.id_) {
    bVar1 = false;
  }
  else {
    LogicalType::ForceMaxLogicalType(&local_60,&(this->super_Expression).return_type,&local_90);
    LogicalType::LogicalType(&local_78,local_90.id_);
    bVar1 = LogicalType::operator==(&local_60,&local_78);
    LogicalType::~LogicalType(&local_78);
    LogicalType::~LogicalType(&local_60);
  }
  uVar3 = 1;
  if (bVar1 == false) {
    local_48._M_unused._M_object = &local_91;
    local_91 = 0;
    local_48._8_8_ = 0;
    pcStack_30 = ::std::
                 _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_cast_expression.cpp:228:47)>
                 ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression/bound_cast_expression.cpp:228:47)>
               ::_M_manager;
    ExpressionIterator::EnumerateChildren
              (&this->super_Expression,(function<void_(const_duckdb::Expression_&)> *)&local_48);
    uVar3 = local_91;
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
      uVar3 = local_91;
    }
  }
  LogicalType::~LogicalType(&local_90);
  return (bool)uVar3;
}

Assistant:

bool BoundCastExpression::CanThrow() const {
	const auto child_type = child->return_type;
	if (return_type.id() != child_type.id() &&
	    LogicalType::ForceMaxLogicalType(return_type, child_type) == child_type.id()) {
		return true;
	}
	bool changes_type = false;
	ExpressionIterator::EnumerateChildren(*this, [&](const Expression &child) { changes_type |= child.CanThrow(); });
	return changes_type;
}